

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_free(void *p)

{
  int iVar1;
  _func_void_sqlite3_mutex_ptr **pp_Var2;
  
  if (p == (void *)0x0) {
    return;
  }
  if (sqlite3Config.bMemstat == 0) {
    pp_Var2 = (_func_void_sqlite3_mutex_ptr **)&sqlite3Config.m.xFree;
  }
  else {
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
    }
    iVar1 = (*sqlite3Config.m.xSize)(p);
    sqlite3Stat.nowValue[0] = sqlite3Stat.nowValue[0] - iVar1;
    if (sqlite3Stat.mxValue[0] < sqlite3Stat.nowValue[0]) {
      sqlite3Stat.mxValue[0] = sqlite3Stat.nowValue[0];
    }
    sqlite3Stat.nowValue[9] = sqlite3Stat.nowValue[9] + -1;
    if (sqlite3Stat.mxValue[9] < sqlite3Stat.nowValue[9]) {
      sqlite3Stat.mxValue[9] = sqlite3Stat.nowValue[9];
    }
    (*sqlite3Config.m.xFree)(p);
    if (mem0.mutex == (sqlite3_mutex *)0x0) {
      return;
    }
    pp_Var2 = &sqlite3Config.mutex.xMutexLeave;
    p = mem0.mutex;
  }
  (**pp_Var2)((sqlite3_mutex *)p);
  return;
}

Assistant:

SQLITE_API void sqlite3_free(void *p){
  if( p==0 ) return;  /* IMP: R-49053-54554 */
  assert( sqlite3MemdebugNoType(p, MEMTYPE_DB) );
  assert( sqlite3MemdebugHasType(p, MEMTYPE_HEAP) );
  if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_mutex_enter(mem0.mutex);
    sqlite3StatusAdd(SQLITE_STATUS_MEMORY_USED, -sqlite3MallocSize(p));
    sqlite3StatusAdd(SQLITE_STATUS_MALLOC_COUNT, -1);
    sqlite3GlobalConfig.m.xFree(p);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    sqlite3GlobalConfig.m.xFree(p);
  }
}